

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  byte *pbVar1;
  ushort *puVar2;
  IMAP *pIVar3;
  curl_trc_feat *pcVar4;
  ulong uVar5;
  long lVar6;
  dynbuf *s;
  char cVar7;
  _Bool _Var8;
  unsigned_short uVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  int iVar12;
  CURLofft CVar13;
  char *pcVar14;
  ulong uVar15;
  void *pvVar16;
  size_t sVar17;
  connectdata *pcVar18;
  byte *pbVar19;
  ulong uStack_90;
  int imapcode;
  dynbuf *local_78;
  curl_off_t size;
  connectdata *local_50;
  SASL *local_48;
  size_t nread;
  char *local_38;
  
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar10 = imap_perform_upgrade_tls(data,conn);
    return CVar10;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar10 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar10;
  }
  local_78 = (dynbuf *)((long)&conn->proto + 0x60);
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar10 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,&imapcode,&nread);
    iVar12 = imapcode;
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    if (imapcode == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (imapcode == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pcVar18 = data->conn;
      if (imapcode != 1) {
        if (imapcode != 3) {
          Curl_failf(data,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        pbVar19 = (byte *)((long)&pcVar18->proto + 0xfb);
        *pbVar19 = *pbVar19 | 2;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"PREAUTH connection, already authenticated");
        }
      }
      CVar11 = imap_perform_capability(data,pcVar18);
      break;
    case IMAP_CAPABILITY:
      pcVar18 = data->conn;
      pcVar14 = Curl_dyn_ptr(&(pcVar18->proto).ftpc.pp.recvbuf);
      if (iVar12 == 0x2a) {
        pbVar19 = (byte *)(pcVar14 + 2);
LAB_00139780:
        do {
          uVar15 = (ulong)*pbVar19;
          if (uVar15 < 0x21) {
            if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
              pbVar19 = pbVar19 + 1;
              goto LAB_00139780;
            }
            if (uVar15 == 0) goto LAB_00139cc3;
          }
          sVar17 = 0xfffffffffffffffb;
          while ((0x20 < (byte)uVar15 || ((0x100002601U >> (uVar15 & 0x3f) & 1) == 0))) {
            lVar6 = sVar17 + 6;
            sVar17 = sVar17 + 1;
            uVar15 = (ulong)pbVar19[lVar6];
          }
          uStack_90 = sVar17 + 5;
          if (uStack_90 == 7) {
            iVar12 = bcmp(pbVar19,"SASL-IR",7);
            if (iVar12 != 0) goto LAB_00139849;
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 0x10;
            uStack_90 = 7;
          }
          else if (uStack_90 == 0xd) {
            iVar12 = bcmp(pbVar19,"LOGINDISABLED",0xd);
            if (iVar12 != 0) goto LAB_00139849;
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 8;
            uStack_90 = 0xd;
          }
          else if (uStack_90 == 8) {
            if (*(long *)pbVar19 != 0x534c545452415453) goto LAB_00139849;
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 4;
            uStack_90 = 8;
          }
          else if (5 < uStack_90) {
LAB_00139849:
            iVar12 = bcmp(pbVar19,"AUTH=",5);
            if (iVar12 == 0) {
              pbVar19 = pbVar19 + 5;
              uVar9 = Curl_sasl_decode_mech((char *)pbVar19,sVar17,(size_t *)&size);
              uStack_90 = sVar17;
              if ((uVar9 != 0) && (size == sVar17)) {
                puVar2 = (ushort *)((long)&pcVar18->proto + 0xb8);
                *puVar2 = *puVar2 | uVar9;
              }
            }
          }
          pbVar19 = pbVar19 + uStack_90;
        } while( true );
      }
      if (((data->set).use_ssl != '\0') && (_Var8 = Curl_conn_is_ssl(pcVar18,0), !_Var8)) {
        if ((iVar12 == 1) && ((*(byte *)((long)&pcVar18->proto + 0xfb) & 6) == 4)) {
          CVar10 = imap_sendf(data,"STARTTLS");
          if (CVar10 != CURLE_OK) {
            return CVar10;
          }
          (data->conn->proto).imapc.state = IMAP_STARTTLS;
          goto LAB_00139cc3;
        }
        if (1 < (data->set).use_ssl) {
          pcVar14 = "STARTTLS not available.";
          goto LAB_00139dbf;
        }
      }
LAB_00139cb2:
      CVar11 = imap_perform_authentication(data,pcVar18);
      break;
    case IMAP_STARTTLS:
      pcVar18 = data->conn;
      if ((pcVar18->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (imapcode != 1) {
        if ((data->set).use_ssl != '\x01') {
          pcVar14 = "STARTTLS denied";
LAB_00139dbf:
          Curl_failf(data,pcVar14);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00139cb2;
      }
      CVar11 = imap_perform_upgrade_tls(data,pcVar18);
      break;
    default:
      goto switchD_0013965b_caseD_4;
    case IMAP_AUTHENTICATE:
      CVar11 = Curl_sasl_continue(local_48,data,imapcode,(saslprogress *)&size);
      if (CVar11 == CURLE_OK) {
        if ((int)size == 0) {
          if (((*(byte *)((long)&conn->proto + 0xfb) & 8) == 0) &&
             (((conn->proto).imapc.preftype & 1) != 0)) {
            CVar11 = imap_perform_login(data,conn);
          }
          else {
            Curl_failf(data,"Authentication cancelled");
            CVar11 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar11 = CURLE_OK;
          CVar10 = CURLE_OK;
          if ((int)size == 2) goto LAB_00139be0;
        }
      }
      break;
    case IMAP_LOGIN:
      if (imapcode != 1) {
        Curl_failf(data,"Access denied. %c",(ulong)(uint)imapcode);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_0013965b_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      pcVar14 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (iVar12 == 1) goto switchD_0013965b_caseD_4;
      if (iVar12 != 0x2a) {
        return CURLE_QUOTE_ERROR;
      }
      CVar11 = Curl_client_write(data,1,pcVar14,(data->conn->proto).ftpc.pp.nfinal);
      break;
    case IMAP_SELECT:
      pcVar18 = data->conn;
      pIVar3 = (data->req).p.imap;
      pcVar14 = Curl_dyn_ptr(&(pcVar18->proto).ftpc.pp.recvbuf);
      if (iVar12 == 1) {
        if (((pIVar3->uidvalidity != (char *)0x0) &&
            (pcVar14 = (pcVar18->proto).ftpc.server_os, pcVar14 != (char *)0x0)) &&
           (iVar12 = curl_strequal(pIVar3->uidvalidity,pcVar14), iVar12 == 0)) {
          Curl_failf(data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar14 = (*Curl_cstrdup)(pIVar3->mailbox);
        (pcVar18->proto).imapc.mailbox = pcVar14;
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (pIVar3->custom == (char *)0x0) {
          if (pIVar3->query == (char *)0x0) {
            CVar11 = imap_perform_fetch(data);
          }
          else {
            CVar11 = imap_perform_search(data);
          }
        }
        else {
          CVar11 = imap_perform_list(data);
        }
        break;
      }
      if (iVar12 != 0x2a) {
        Curl_failf(data,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      local_50 = pcVar18;
      iVar12 = curl_strnequal(pcVar14 + 2,"OK [UIDVALIDITY ",0x10);
      if (iVar12 != 0) {
        for (sVar17 = 0; sVar17 != 0x14; sVar17 = sVar17 + 1) {
          cVar7 = (pcVar14 + 0x12)[sVar17];
          if (9 < (byte)(cVar7 - 0x30U)) {
            if (sVar17 != 0) goto LAB_00139c18;
            goto LAB_00139cc3;
          }
        }
        cVar7 = pcVar14[0x26];
LAB_00139c18:
        if (cVar7 == ']') {
          Curl_dyn_init((dynbuf *)&size,0x14);
          CVar10 = Curl_dyn_addn((dynbuf *)&size,pcVar14 + 0x12,sVar17);
          pcVar18 = local_50;
          if (CVar10 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          (*Curl_cfree)((local_50->proto).ftpc.server_os);
          (pcVar18->proto).ftpc.server_os = (char *)0x0;
          pcVar14 = Curl_dyn_ptr((dynbuf *)&size);
          (pcVar18->proto).ftpc.server_os = pcVar14;
        }
      }
      goto LAB_00139cc3;
    case IMAP_FETCH:
      pcVar14 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      size = 0;
      if (iVar12 == 0x2a) {
        pvVar16 = memchr(pcVar14,0x7b,(data->conn->proto).ftpc.pp.nfinal);
        if ((((pvVar16 == (void *)0x0) ||
             (CVar13 = curlx_strtoofft((char *)((long)pvVar16 + 1),&local_38,10,&size),
             CVar13 != CURL_OFFT_OK)) || ((long)local_38 - (long)pvVar16 < 2)) || (*local_38 != '}')
           ) {
          Curl_failf(data,"Failed to parse FETCH response.");
          CVar10 = CURLE_WEIRD_SERVER_REPLY;
        }
        else {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"Found %ld bytes to download",size);
          }
          Curl_pgrsSetDownloadSize(data,size);
          s = local_78;
          uVar15 = (conn->proto).ftpc.pp.overflow;
          if (uVar15 == 0) {
LAB_00139d14:
            if ((data->req).bytecount != size) {
              (data->req).maxdownload = size;
              (data->state).select_bits = '\x01';
              Curl_xfer_setup1(data,1,size,false);
              CVar10 = CURLE_OK;
              goto LAB_00139be0;
            }
            Curl_xfer_setup_nop(data);
          }
          else {
            Curl_dyn_tail(local_78,uVar15);
            (conn->proto).ftpc.pp.nfinal = 0;
            if ((ulong)size <= uVar15) {
              uVar15 = size;
            }
            if (size != 0) {
              pcVar14 = Curl_dyn_ptr(s);
              CVar11 = Curl_client_write(data,1,pcVar14,uVar15);
              if (CVar11 != CURLE_OK) break;
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"Written %zu bytes, %lu bytes are left for transfer",uVar15);
              }
              uVar5 = (conn->proto).ftpc.pp.overflow;
              sVar17 = uVar5 - uVar15;
              if (uVar5 < uVar15 || sVar17 == 0) {
                (conn->proto).ftpc.pp.overflow = 0;
                Curl_dyn_reset(local_78);
              }
              else {
                (conn->proto).ftpc.pp.overflow = sVar17;
                Curl_dyn_tail(local_78,sVar17);
              }
              goto LAB_00139d14;
            }
          }
          CVar10 = CURLE_OK;
        }
      }
      else {
        Curl_pgrsSetDownloadSize(data,-1);
        CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00139be0:
      CVar11 = CVar10;
      (data->conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (imapcode != 1) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto switchD_0013965b_caseD_4;
    case IMAP_APPEND:
      if (imapcode != 0x2b) {
        return CURLE_UPLOAD_FAILED;
      }
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      Curl_xfer_setup1(data,2,-1,false);
      goto switchD_0013965b_caseD_4;
    case IMAP_APPEND_FINAL:
      if (imapcode != 1) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_0013965b_caseD_4:
      (data->conn->proto).imapc.state = IMAP_STOP;
      goto LAB_00139cc3;
    }
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
LAB_00139cc3:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}